

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commit_state.cpp
# Opt level: O0

void __thiscall duckdb::CommitState::CommitEntry(CommitState *this,UndoFlags type,data_ptr_t data)

{
  DependencyEntryType DVar1;
  bool bVar2;
  int iVar3;
  CatalogEntry *this_00;
  undefined4 extraout_var;
  CatalogEntry *entry;
  DependencyEntry *this_01;
  CatalogSet *this_02;
  string *msg;
  ulong vector_idx;
  const_data_ptr_t in_RDX;
  int in_ESI;
  idx_t in_RDI;
  UpdateInfo *info_2;
  DeleteInfo *info_1;
  AppendInfo *info;
  lock_guard<std::mutex> read_lock;
  lock_guard<std::mutex> write_lock;
  DuckCatalog *duck_catalog;
  DependencyEntry *dep;
  CatalogEntry *new_entry;
  Catalog *catalog;
  CatalogEntry *old_entry;
  data_ptr_t in_stack_00000320;
  CatalogEntry *in_stack_00000328;
  CommitState *in_stack_00000330;
  mutex_type *in_stack_ffffffffffffff28;
  CatalogEntry *in_stack_ffffffffffffff30;
  allocator *this_03;
  __int_type in_stack_ffffffffffffff38;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff40;
  DeleteInfo *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff66;
  allocator in_stack_ffffffffffffff67;
  string local_98 [88];
  DuckCatalog *local_40;
  CatalogEntry *in_stack_ffffffffffffffc8;
  transaction_t commit_id;
  
  vector_idx = (ulong)(in_ESI - 1);
  switch(vector_idx) {
  case 0:
    this_00 = Load<duckdb::CatalogEntry*>(in_RDX);
    iVar3 = (*this_00->_vptr_CatalogEntry[0xb])();
    commit_id = CONCAT44(extraout_var,iVar3);
    entry = CatalogEntry::Parent((CatalogEntry *)0xcc1bc1);
    if (entry->type == DEPENDENCY_ENTRY) {
      this_01 = CatalogEntry::Cast<duckdb::DependencyEntry>(in_stack_ffffffffffffff30);
      DVar1 = DependencyEntry::Side(this_01);
      if (DVar1 == SUBJECT) {
        optional_ptr<duckdb::CatalogSet,_true>::operator->
                  ((optional_ptr<duckdb::CatalogSet,_true> *)in_stack_ffffffffffffff30);
        CatalogSet::VerifyExistenceOfDependency((CatalogSet *)this_00,commit_id,entry);
      }
    }
    else if ((entry->type == DELETED_ENTRY) &&
            (bVar2 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&this_00->set),
            bVar2)) {
      optional_ptr<duckdb::CatalogSet,_true>::operator->
                ((optional_ptr<duckdb::CatalogSet,_true> *)in_stack_ffffffffffffff30);
      CatalogSet::CommitDrop
                ((CatalogSet *)this_00,commit_id,(transaction_t)entry,in_stack_ffffffffffffffc8);
    }
    local_40 = Catalog::Cast<duckdb::DuckCatalog>((Catalog *)in_stack_ffffffffffffff30);
    DuckCatalog::GetWriteLock(local_40);
    ::std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    this_02 = optional_ptr<duckdb::CatalogSet,_true>::operator->
                        ((optional_ptr<duckdb::CatalogSet,_true> *)in_stack_ffffffffffffff30);
    CatalogSet::GetCatalogLock(this_02);
    ::std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    CatalogEntry::Parent((CatalogEntry *)0xcc1cfd);
    CatalogSet::UpdateTimestamp(in_stack_ffffffffffffff30,(transaction_t)in_stack_ffffffffffffff28);
    CommitEntryDrop(in_stack_00000330,in_stack_00000328,in_stack_00000320);
    ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xcc1d46);
    ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xcc1d53);
    break;
  case 1:
    DataTable::CommitAppend
              ((DataTable *)
               CONCAT17(in_stack_ffffffffffffff67,
                        CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),vector_idx,
               in_RDI,(idx_t)in_stack_ffffffffffffff48);
    break;
  case 2:
    RowVersionManager::CommitDelete
              ((RowVersionManager *)
               CONCAT17(in_stack_ffffffffffffff67,
                        CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),vector_idx,
               in_RDI,in_stack_ffffffffffffff48);
    break;
  case 3:
    ::std::__atomic_base<unsigned_long>::operator=
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    break;
  case 4:
    break;
  default:
    msg = (string *)__cxa_allocate_exception(0x10);
    this_03 = (allocator *)&stack0xffffffffffffff67;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_98,"UndoBuffer - don\'t know how to commit this type!",this_03);
    InternalException::InternalException((InternalException *)this_03,msg);
    __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return;
}

Assistant:

void CommitState::CommitEntry(UndoFlags type, data_ptr_t data) {
	switch (type) {
	case UndoFlags::CATALOG_ENTRY: {
		auto &old_entry = *Load<CatalogEntry *>(data);
		D_ASSERT(old_entry.HasParent());

		auto &catalog = old_entry.ParentCatalog();
		D_ASSERT(catalog.IsDuckCatalog());

		auto &new_entry = old_entry.Parent();
		if (new_entry.type == CatalogType::DEPENDENCY_ENTRY) {
			auto &dep = new_entry.Cast<DependencyEntry>();
			if (dep.Side() == DependencyEntryType::SUBJECT) {
				new_entry.set->VerifyExistenceOfDependency(commit_id, new_entry);
			}
		} else if (new_entry.type == CatalogType::DELETED_ENTRY && old_entry.set) {
			old_entry.set->CommitDrop(commit_id, transaction.start_time, old_entry);
		}
		// Grab a write lock on the catalog
		auto &duck_catalog = catalog.Cast<DuckCatalog>();
		lock_guard<mutex> write_lock(duck_catalog.GetWriteLock());
		lock_guard<mutex> read_lock(old_entry.set->GetCatalogLock());
		// Set the timestamp of the catalog entry to the given commit_id, marking it as committed
		CatalogSet::UpdateTimestamp(old_entry.Parent(), commit_id);

		// drop any blocks associated with the catalog entry if possible (e.g. in case of a DROP or ALTER)
		CommitEntryDrop(old_entry, data + sizeof(CatalogEntry *));
		break;
	}
	case UndoFlags::INSERT_TUPLE: {
		// append:
		auto info = reinterpret_cast<AppendInfo *>(data);
		// mark the tuples as committed
		info->table->CommitAppend(commit_id, info->start_row, info->count);
		break;
	}
	case UndoFlags::DELETE_TUPLE: {
		// deletion:
		auto info = reinterpret_cast<DeleteInfo *>(data);
		// mark the tuples as committed
		info->version_info->CommitDelete(info->vector_idx, commit_id, *info);
		break;
	}
	case UndoFlags::UPDATE_TUPLE: {
		// update:
		auto info = reinterpret_cast<UpdateInfo *>(data);
		info->version_number = commit_id;
		break;
	}
	case UndoFlags::SEQUENCE_VALUE: {
		break;
	}
	default:
		throw InternalException("UndoBuffer - don't know how to commit this type!");
	}
}